

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffc_backend.c
# Opt level: O0

int ossl_ffc_params_fromdata(FFC_PARAMS *ffc,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  OSSL_PARAM *pOVar3;
  OSSL_PARAM *pOVar4;
  FFC_PARAMS *in_RDI;
  char *props;
  OSSL_PARAM *p1;
  DH_NAMED_GROUP *group;
  int i;
  BIGNUM *j;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p;
  OSSL_PARAM *param_g;
  OSSL_PARAM *param_q;
  OSSL_PARAM *param_p;
  OSSL_PARAM *prm;
  FFC_PARAMS *in_stack_ffffffffffffff88;
  FFC_PARAMS *in_stack_ffffffffffffff90;
  FFC_PARAMS *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  
  if (in_RDI == (FFC_PARAMS *)0x0) {
    return 0;
  }
  pOVar2 = OSSL_PARAM_locate_const
                     ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  if ((pOVar2 == (OSSL_PARAM *)0x0) ||
     (((pOVar2->data_type == 4 &&
       (in_stack_ffffffffffffff98 =
             (FFC_PARAMS *)ossl_ffc_name_to_dh_named_group((char *)in_stack_ffffffffffffff88),
       in_stack_ffffffffffffff98 != (FFC_PARAMS *)0x0)) &&
      (iVar1 = ossl_ffc_named_group_set_pqg(in_stack_ffffffffffffff88,(DH_NAMED_GROUP *)0x280581),
      iVar1 != 0)))) {
    pOVar2 = OSSL_PARAM_locate_const
                       ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    pOVar3 = OSSL_PARAM_locate_const
                       ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    pOVar4 = OSSL_PARAM_locate_const
                       ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    if ((((pOVar2 == (OSSL_PARAM *)0x0) ||
         (iVar1 = OSSL_PARAM_get_BN((OSSL_PARAM *)in_stack_ffffffffffffff98,
                                    &in_stack_ffffffffffffff90->p), iVar1 != 0)) &&
        ((pOVar4 == (OSSL_PARAM *)0x0 ||
         (iVar1 = OSSL_PARAM_get_BN((OSSL_PARAM *)in_stack_ffffffffffffff98,
                                    &in_stack_ffffffffffffff90->p), iVar1 != 0)))) &&
       ((pOVar3 == (OSSL_PARAM *)0x0 ||
        (iVar1 = OSSL_PARAM_get_BN((OSSL_PARAM *)in_stack_ffffffffffffff98,
                                   &in_stack_ffffffffffffff90->p), iVar1 != 0)))) {
      pOVar2 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88)
      ;
      if (pOVar2 != (OSSL_PARAM *)0x0) {
        iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                   (int *)in_stack_ffffffffffffff88);
        if (iVar1 == 0) goto LAB_0028090e;
        in_RDI->gindex = in_stack_ffffffffffffffa4;
      }
      pOVar2 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88)
      ;
      if (pOVar2 != (OSSL_PARAM *)0x0) {
        iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                   (int *)in_stack_ffffffffffffff88);
        if (iVar1 == 0) goto LAB_0028090e;
        in_RDI->pcounter = in_stack_ffffffffffffffa4;
      }
      pOVar2 = OSSL_PARAM_locate_const
                         ((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88)
      ;
      if ((pOVar2 == (OSSL_PARAM *)0x0) ||
         (iVar1 = OSSL_PARAM_get_BN((OSSL_PARAM *)in_stack_ffffffffffffff98,
                                    &in_stack_ffffffffffffff90->p), iVar1 != 0)) {
        pOVar2 = OSSL_PARAM_locate_const
                           ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                            (char *)in_stack_ffffffffffffff88);
        if (pOVar2 != (OSSL_PARAM *)0x0) {
          iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                     (int *)in_stack_ffffffffffffff88);
          if (iVar1 == 0) goto LAB_0028090e;
          in_RDI->h = in_stack_ffffffffffffffa4;
        }
        pOVar2 = OSSL_PARAM_locate_const
                           ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                            (char *)in_stack_ffffffffffffff88);
        if ((pOVar2 == (OSSL_PARAM *)0x0) ||
           ((pOVar2->data_type == 5 &&
            (iVar1 = ossl_ffc_params_set_seed
                               (in_stack_ffffffffffffff98,(uchar *)in_stack_ffffffffffffff90,
                                (size_t)in_stack_ffffffffffffff88), iVar1 != 0)))) {
          pOVar2 = OSSL_PARAM_locate_const
                             ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if (pOVar2 != (OSSL_PARAM *)0x0) {
            iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                       (int *)in_stack_ffffffffffffff88);
            if (iVar1 == 0) goto LAB_0028090e;
            ossl_ffc_params_enable_flags(in_RDI,1,in_stack_ffffffffffffffa4);
          }
          pOVar2 = OSSL_PARAM_locate_const
                             ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if (pOVar2 != (OSSL_PARAM *)0x0) {
            iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                       (int *)in_stack_ffffffffffffff88);
            if (iVar1 == 0) goto LAB_0028090e;
            ossl_ffc_params_enable_flags(in_RDI,2,in_stack_ffffffffffffffa4);
          }
          pOVar2 = OSSL_PARAM_locate_const
                             ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if (pOVar2 != (OSSL_PARAM *)0x0) {
            iVar1 = OSSL_PARAM_get_int((OSSL_PARAM *)in_stack_ffffffffffffff90,
                                       (int *)in_stack_ffffffffffffff88);
            if (iVar1 == 0) goto LAB_0028090e;
            ossl_ffc_params_enable_flags(in_RDI,4,in_stack_ffffffffffffffa4);
          }
          pOVar2 = OSSL_PARAM_locate_const
                             ((OSSL_PARAM *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if ((pOVar2 == (OSSL_PARAM *)0x0) ||
             ((in_stack_ffffffffffffff88 = (FFC_PARAMS *)0x0, pOVar2->data_type == 4 &&
              (((in_stack_ffffffffffffff90 =
                      (FFC_PARAMS *)
                      OSSL_PARAM_locate_const((OSSL_PARAM *)in_stack_ffffffffffffff90,(char *)0x0),
                in_stack_ffffffffffffff90 == (FFC_PARAMS *)0x0 ||
                (*(uint *)&in_stack_ffffffffffffff90->q == 4)) &&
               (iVar1 = ossl_ffc_set_digest(in_RDI,(char *)pOVar2->data,
                                            (char *)in_stack_ffffffffffffff88), iVar1 != 0)))))) {
            ossl_ffc_params_set0_pqg
                      ((FFC_PARAMS *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (BIGNUM *)in_stack_ffffffffffffff98,(BIGNUM *)in_stack_ffffffffffffff90,
                       (BIGNUM *)in_stack_ffffffffffffff88);
            ossl_ffc_params_set0_j(in_stack_ffffffffffffff90,(BIGNUM *)in_stack_ffffffffffffff88);
            return 1;
          }
        }
      }
    }
  }
LAB_0028090e:
  BN_free((BIGNUM *)0x0);
  BN_free((BIGNUM *)0x0);
  BN_free((BIGNUM *)0x0);
  BN_free((BIGNUM *)0x0);
  return 0;
}

Assistant:

int ossl_ffc_params_fromdata(FFC_PARAMS *ffc, const OSSL_PARAM params[])
{
    const OSSL_PARAM *prm;
    const OSSL_PARAM *param_p, *param_q, *param_g;
    BIGNUM *p = NULL, *q = NULL, *g = NULL, *j = NULL;
    int i;

    if (ffc == NULL)
        return 0;

    prm  = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_GROUP_NAME);
    if (prm != NULL) {
        /*
         * In a no-dh build we just go straight to err because we have no
         * support for this.
         */
#ifndef OPENSSL_NO_DH
        const DH_NAMED_GROUP *group = NULL;

        if (prm->data_type != OSSL_PARAM_UTF8_STRING
            || (group = ossl_ffc_name_to_dh_named_group(prm->data)) == NULL
            || !ossl_ffc_named_group_set_pqg(ffc, group))
#endif
            goto err;
    }

    param_p = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_P);
    param_g = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_G);
    param_q = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_Q);

    if ((param_p != NULL && !OSSL_PARAM_get_BN(param_p, &p))
        || (param_q != NULL && !OSSL_PARAM_get_BN(param_q, &q))
        || (param_g != NULL && !OSSL_PARAM_get_BN(param_g, &g)))
        goto err;

    prm = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_GINDEX);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ffc->gindex =  i;
    }
    prm = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_PCOUNTER);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ffc->pcounter = i;
    }
    prm = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_COFACTOR);
    if (prm != NULL && !OSSL_PARAM_get_BN(prm, &j))
        goto err;
    prm = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_H);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ffc->h =  i;
    }
    prm  = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_SEED);
    if (prm != NULL) {
        if (prm->data_type != OSSL_PARAM_OCTET_STRING)
            goto err;
        if (!ossl_ffc_params_set_seed(ffc, prm->data, prm->data_size))
            goto err;
    }
    prm  = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_VALIDATE_PQ);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ossl_ffc_params_enable_flags(ffc, FFC_PARAM_FLAG_VALIDATE_PQ, i);
    }
    prm  = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_VALIDATE_G);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ossl_ffc_params_enable_flags(ffc, FFC_PARAM_FLAG_VALIDATE_G, i);
    }
    prm  = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_VALIDATE_LEGACY);
    if (prm != NULL) {
        if (!OSSL_PARAM_get_int(prm, &i))
            goto err;
        ossl_ffc_params_enable_flags(ffc, FFC_PARAM_FLAG_VALIDATE_LEGACY, i);
    }

    prm = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_DIGEST);
    if (prm != NULL) {
        const OSSL_PARAM *p1;
        const char *props = NULL;

        if (prm->data_type != OSSL_PARAM_UTF8_STRING)
            goto err;
        p1 = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_FFC_DIGEST_PROPS);
        if (p1 != NULL) {
            if (p1->data_type != OSSL_PARAM_UTF8_STRING)
                goto err;
        }
        if (!ossl_ffc_set_digest(ffc, prm->data, props))
            goto err;
    }

    ossl_ffc_params_set0_pqg(ffc, p, q, g);
    ossl_ffc_params_set0_j(ffc, j);
    return 1;

 err:
    BN_free(j);
    BN_free(p);
    BN_free(q);
    BN_free(g);
    return 0;
}